

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O2

int lib::base::DoIPairs(State *state)

{
  bool bVar1;
  Table *this;
  int iVar2;
  double dVar3;
  Value VVar4;
  anon_union_8_9_8deb4486_for_Value_0 local_50;
  ValueT local_48;
  StackAPI api;
  anon_union_8_9_8deb4486_for_Value_0 local_30;
  undefined4 local_28;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>(&api,2,ValueT_Table,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    this = luna::StackAPI::GetTable(&api,0);
    dVar3 = luna::StackAPI::GetNumber(&api,1);
    local_30.num_ = dVar3 + 1.0;
    local_28 = 2;
    VVar4 = luna::Table::GetValue(this,(Value *)&local_30);
    local_50 = VVar4.field_0;
    local_48 = VVar4.type_;
    iVar2 = 0;
    if (local_48 != ValueT_Nil) {
      luna::StackAPI::PushValue(&api,(Value *)&local_30);
      luna::StackAPI::PushValue(&api,(Value *)&local_50);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

int DoIPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table, luna::ValueT_Number))
            return 0;

        luna::Table *t = api.GetTable(0);
        double num = api.GetNumber(1) + 1;

        luna::Value k;
        k.type_ = luna::ValueT_Number;
        k.num_ = num;
        luna::Value v = t->GetValue(k);

        if (v.type_ == luna::ValueT_Nil)
            return 0;

        api.PushValue(k);
        api.PushValue(v);
        return 2;
    }